

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QMap<QString,_QVariant> __thiscall
QMap<QString,_QMap<QString,_QVariant>_>::value
          (QMap<QString,_QMap<QString,_QVariant>_> *this,QString *key,
          QMap<QString,_QVariant> *defaultValue)

{
  bool bVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
  *in_stack_ffffffffffffffa8;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr = in_RDI.d.ptr;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                      *)0x169e46);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                  *)0x169e74);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x169e85);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                  *)0x169e94);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_QString,_QMap<QString,_QVariant>_>_> *)
                 0x169ec4);
      QMap<QString,_QVariant>::QMap
                ((QMap<QString,_QVariant> *)this_00.d.ptr,
                 (QMap<QString,_QVariant> *)in_stack_ffffffffffffffa8);
    }
    else {
      QMap<QString,_QVariant>::QMap
                ((QMap<QString,_QVariant> *)this_00.d.ptr,
                 (QMap<QString,_QVariant> *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    QMap<QString,_QVariant>::QMap
              ((QMap<QString,_QVariant> *)this_00.d.ptr,
               (QMap<QString,_QVariant> *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              )in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }